

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

atomic<google::protobuf::internal::SerialArena_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::arena
          (SerialArenaChunk *this,uint32_t i)

{
  long lVar1;
  string *psVar2;
  string *psVar3;
  string local_20 [16];
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                 );
  }
  if (i < *(uint *)(this + 8)) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((ulong)i,(ulong)*(uint *)(this + 8),"i < capacity()");
  }
  if (psVar2 == (string *)0x0) {
    return (atomic<google::protobuf::internal::SerialArena_*> *)
           (this + (ulong)i * 8 + (ulong)*(uint *)(this + 8) * 8 + 0x10);
  }
  psVar2 = local_20;
  arena();
  if (LazyString::Init[abi:cxx11]()::mu == '\0') {
    LazyString::Init_abi_cxx11_();
  }
  absl::lts_20240722::Mutex::Lock();
  psVar3 = *(string **)(psVar2 + 0x20);
  if (*(string **)(psVar2 + 0x20) == (string *)0x0) {
    lVar1 = *(long *)psVar2;
    *(string **)psVar2 = psVar2 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar2,lVar1,*(long *)(psVar2 + 8) + lVar1);
    *(string **)(psVar2 + 0x20) = psVar2;
    psVar3 = psVar2;
  }
  absl::lts_20240722::Mutex::Unlock();
  return (atomic<google::protobuf::internal::SerialArena_*> *)psVar3;
}

Assistant:

const std::atomic<SerialArena*>& arena(uint32_t i) const {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kArenas>(ptr())[i];
  }